

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<9,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()
          (static_for<9,_uWS::WebSocketHandshake::Sha1Loop<4>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<8,_uWS::WebSocketHandshake::Sha1Loop<4>_> local_11;
  
  static_for<8,_uWS::WebSocketHandshake::Sha1Loop<4>_>::operator()(&local_11,a,b);
  uVar1 = b[8] ^ b[0xd] ^ b[2] ^ *b;
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  *b = uVar2;
  uVar1 = a[1];
  a[3] = a[3] + (a[2] << 5 | a[2] >> 0x1b) + uVar2 + (*a & uVar1 | (*a | uVar1) & a[4]) + 0x8f1bbcdc
  ;
  a[1] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }